

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O1

ConsCell * find_cdrpair_in_page(conspage *pg,LispPTR carpart,LispPTR cdrpart)

{
  uint uVar1;
  uint uVar2;
  ConsCell *pCVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  
  uVar1 = *(uint *)&pg->field_0x8;
  if ((uVar1 < 0x2000000) || (uVar9 = uVar1 >> 0x10 & 0xff, uVar9 == 0)) {
    return (ConsCell *)0x0;
  }
  uVar8 = 0;
  uVar4 = 0;
  while( true ) {
    uVar10 = uVar9;
    if (uVar4 <= uVar10 + 0xe && uVar10 < uVar4) {
      uVar2 = 0;
      uVar9 = uVar10;
      goto LAB_00113aac;
    }
    uVar6 = (ulong)uVar10;
    if (uVar10 <= uVar4 + 0xe && (uVar4 < uVar10 && uVar4 != 0)) break;
    uVar2 = *(uint *)((long)&pg->cell6 + uVar6 * 2);
    uVar8 = (ulong)uVar4;
    uVar9 = uVar2 >> 0x18;
    uVar4 = uVar10;
    if (uVar2 < 0x1000000) {
      return (ConsCell *)0x0;
    }
  }
  lVar11 = (ulong)uVar4 * 2;
  lVar7 = uVar6 * 2;
  uVar9 = *(uint *)((long)&pg->cell6 + uVar6 * 2);
  if ((int)uVar8 == 0) {
    *(uint *)&pg->field_0x8 = uVar1 & 0xff00ffff | uVar9 >> 8 & 0xff0000;
  }
  else {
    *(char *)((long)&pg->cell6 + uVar8 * 2 + 3) = (char)(uVar9 >> 0x18);
  }
  pCVar3 = (ConsCell *)((long)&pg->cell6 + (ulong)uVar4 * 2);
  goto LAB_00113b54;
  while (uVar10 = uVar4, uVar2 = uVar9, uVar9 = uVar13, uVar13 < uVar4) {
LAB_00113aac:
    uVar12 = uVar2;
    uVar5 = uVar10;
    uVar6 = (ulong)uVar9;
    uVar13 = *(uint *)((long)&pg->cell6 + uVar6 * 2) >> 0x18;
    if (uVar13 <= uVar9) break;
  }
  uVar9 = *(uint *)((long)&pg->cell6 + (ulong)uVar5 * 2);
  if ((int)uVar8 == 0) {
    *(uint *)&pg->field_0x8 = uVar1 & 0xff00ffff | uVar9 >> 8 & 0xff0000;
  }
  else {
    *(char *)((long)&pg->cell6 + uVar8 * 2 + 3) = (char)(uVar9 >> 0x18);
  }
  pCVar3 = (ConsCell *)((long)&pg->cell6 + uVar6 * 2);
  lVar11 = uVar6 * 2;
  lVar7 = (ulong)uVar4 * 2;
  if (uVar12 != 0) {
    *(undefined1 *)((long)&pg->cell6 + (ulong)uVar12 * 2 + 3) = pCVar3->field_0x3;
  }
LAB_00113b54:
  pg->field_0xb = (char)((uint)(byte)pg->field_0xb * 0x1000000 + -0x2000000 >> 0x18);
  *(LispPTR *)((long)&pg->cell6 + lVar11) = carpart;
  *(LispPTR *)((long)&pg->cell6 + lVar7) = cdrpart;
  *pCVar3 = (ConsCell)((uint)*pCVar3 & 0xfffffff | ((int)lVar7 - (int)lVar11 & 0xfffffffcU) << 0x1a)
  ;
  return pCVar3;
}

Assistant:

static ConsCell *find_cdrpair_in_page(struct conspage *pg, LispPTR carpart, LispPTR cdrpart) {
  unsigned offset, prior, priorprior, nprior, poffset, noffset;

  prior = priorprior = nprior = 0;

  if (pg->count < 2) return (ConsCell *)0;

  offset = pg->next_cell;

  while (offset) {
    if (prior && (offset < prior) && (prior <= offset + 14)) {
      ConsCell *carcell, *cdrcell;

      poffset = offset;
      noffset = FREECONS(pg, offset)->next_free;
      while ((noffset > offset) && (noffset < prior)) {
        nprior = offset;
        poffset = prior;
        offset = noffset;
        noffset = FREECONS(pg, offset)->next_free;
      }

      carcell = (ConsCell *)(((DLword *)pg) + offset);
      cdrcell = (ConsCell *)(((DLword *)pg) + prior);
      if (priorprior)
        FREECONS(pg, priorprior)->next_free = FREECONS(pg, poffset)->next_free;
      else
        pg->next_cell = FREECONS(pg, poffset)->next_free;

      if (nprior) FREECONS(pg, nprior)->next_free = FREECONS(pg, offset)->next_free;

      pg->count -= 2;

      *(LispPTR *)carcell = carpart;
      *(LispPTR *)cdrcell = cdrpart;

      carcell->cdr_code = (cdrcell - carcell);
      return (carcell);
    } else if (prior && (offset > prior) && (offset <= prior + 14)) {
      ConsCell *carcell, *cdrcell;

      carcell = (ConsCell *)(((DLword *)pg) + prior);
      cdrcell = (ConsCell *)(((DLword *)pg) + offset);
      if (priorprior)
        FREECONS(pg, priorprior)->next_free = ((freecons *)cdrcell)->next_free;
      else
        pg->next_cell = ((freecons *)cdrcell)->next_free;

      pg->count -= 2;

      *(LispPTR *)carcell = carpart;
      *(LispPTR *)cdrcell = cdrpart;

      carcell->cdr_code = (cdrcell - carcell);
      return (carcell);
    }
    priorprior = prior;
    prior = offset;
    offset = FREECONS(pg, offset)->next_free;
  }

  return (0); /* found no entries in this page, so return failure code */
}